

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineSegmentedPath.cpp
# Opt level: O1

void __thiscall
OpenSteer::PolylineSegmentedPath::PolylineSegmentedPath
          (PolylineSegmentedPath *this,size_type numOfPoints,Vec3 *newPoints,bool closedCycle)

{
  (this->super_SegmentedPath).super_Path._vptr_Path =
       (_func_int **)&PTR__PolylineSegmentedPath_00179c00;
  (this->points_).super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->points_).super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->points_).super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->segmentTangents_).super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->segmentTangents_).super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->segmentTangents_).super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->segmentLengths_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->segmentLengths_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->segmentLengths_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->closedCycle_ = closedCycle;
  setPath(this,numOfPoints,newPoints,closedCycle);
  return;
}

Assistant:

OpenSteer::PolylineSegmentedPath::PolylineSegmentedPath( size_type numOfPoints,
                                                         Vec3 const newPoints[],
                                                         bool closedCycle )
    : points_( 0 ), segmentTangents_( 0 ), segmentLengths_( 0 ), closedCycle_( closedCycle )
{
        setPath( numOfPoints, newPoints, closedCycle );
}